

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<unsigned_long,_void>::findPosition
          (HighsHashTable<unsigned_long,_void> *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos
          ,u64 *pos)

{
  byte bVar1;
  _Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false> _Var2;
  uchar *puVar3;
  u64 uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = *key & 0xffffffff;
  uVar5 = *key >> 0x20;
  uVar5 = (uVar5 + 0x80c8963be3e4c2f3) * (uVar6 + 0xc8497d2a400d9551) >> 0x20 ^
          (uVar5 + 0x8a183895eeac1536) * (uVar6 + 0x42d8680e260ae5b);
  uVar6 = uVar5 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar6;
  *maxPos = uVar6 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar5 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var2._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<unsigned_long,_void>,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_HighsHashTable<unsigned_long,_void>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<unsigned_long,_void>_*,_false>._M_head_impl;
  *pos = *startPos;
  puVar3 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  do {
    uVar4 = *pos;
    bVar1 = puVar3[uVar4];
    if (-1 < (char)bVar1) {
      return false;
    }
    if ((bVar1 == *meta) && (*key == _Var2._M_head_impl[uVar4].value_)) {
      return true;
    }
    if ((ulong)((int)uVar4 - (uint)bVar1 & 0x7f) < (uVar4 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar5 = this->tableSizeMask & uVar4 + 1;
    *pos = uVar5;
  } while (uVar5 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }